

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Transmitter_PDU::Decode(Transmitter_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 *T;
  pointer *ppcVar1;
  iterator iVar2;
  KUINT16 KVar3;
  KException *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  byte bVar6;
  KOCTET o;
  KString local_58;
  vector<char,std::allocator<char>> *local_38;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (0x67 < iVar4 + (uint)KVar3) {
    Radio_Communications_Header::Decode
              (&this->super_Radio_Communications_Header,stream,ignoreHeader);
    (*(this->m_RadioEntityType).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_RadioEntityType,stream);
    KDataStream::Read(stream,&this->m_ui8TransmitterState);
    KDataStream::Read(stream,&this->m_ui8InputSource);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
    (*(this->m_AntennaLocation).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AntennaLocation,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16AntennaPatternType);
    T = &this->m_ui16AntennaPatternLength;
    KDataStream::Read<unsigned_short>(stream,T);
    KDataStream::Read<unsigned_long_long>(stream,&this->m_ui64Freq);
    KDataStream::Read<float>(stream,(float *)&this->m_f32TransmitFreqBW);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Power);
    (*(this->m_ModulationType).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_ModulationType,stream);
    (*(this->m_CryptoSystem).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_CryptoSystem,stream)
    ;
    KDataStream::Read(stream,&this->m_ui8LengthOfModulationParam);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding2);
    KDataStream::Read(stream,&this->m_ui8Padding3);
    if (this->m_ui8LengthOfModulationParam != '\0') {
      local_38 = (vector<char,std::allocator<char>> *)&this->m_vModulationParams;
      bVar6 = 0;
      do {
        KDataStream::Read(stream,(KOCTET *)&local_58);
        iVar2._M_current =
             (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    (local_38,iVar2,(char *)&local_58);
        }
        else {
          *iVar2._M_current = (char)local_58._M_dataplus._M_p;
          ppcVar1 = &(this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        bVar6 = bVar6 + 1;
      } while (bVar6 < this->m_ui8LengthOfModulationParam);
    }
    if (*T != 0) {
      uVar5 = 0;
      do {
        KDataStream::Read(stream,(KOCTET *)&local_58);
        iVar2._M_current =
             (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&this->m_vAntennaPattern,iVar2,
                     (char *)&local_58);
        }
        else {
          *iVar2._M_current = (char)local_58._M_dataplus._M_p;
          ppcVar1 = &(this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < *T);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
  KException::KException(this_00,&local_58,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Transmitter_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < TRANSMITTER_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Radio_Communications_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_RadioEntityType
           >> m_ui8TransmitterState
           >> m_ui8InputSource
           >> m_ui16Padding1
           >> KDIS_STREAM m_AntennaLocation
           >> m_ui16AntennaPatternType
           >> m_ui16AntennaPatternLength
           >> m_ui64Freq
           >> m_f32TransmitFreqBW
           >> m_f32Power
           >> KDIS_STREAM m_ModulationType
           >> KDIS_STREAM m_CryptoSystem
           >> m_ui8LengthOfModulationParam
           >> m_ui16Padding2
           >> m_ui8Padding3;

    for( KUINT8 i = 0; i < m_ui8LengthOfModulationParam; ++i )
    {
        KOCTET o;
        stream >> o;
        m_vModulationParams.push_back( o );
    }

    for( KUINT16 i = 0; i < m_ui16AntennaPatternLength; ++i )
    {
        KOCTET o;
        stream >> o;
        m_vAntennaPattern.push_back( o );
    }
}